

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O0

void dr_prediction_z3_4x4_avx2(uint8_t *dst,ptrdiff_t stride,uint8_t *left,int upsample_left,int dy)

{
  byte bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  undefined8 uVar36;
  undefined8 uVar37;
  undefined8 uVar38;
  undefined8 uVar39;
  undefined8 uVar40;
  undefined8 uVar41;
  undefined8 uVar42;
  undefined8 uVar43;
  undefined8 uVar44;
  undefined8 uVar45;
  undefined8 uVar46;
  undefined8 uVar47;
  undefined8 uVar48;
  undefined8 uVar49;
  undefined1 auVar50 [32];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  int iVar55;
  int iVar56;
  int iVar57;
  undefined1 (*pauVar58) [16];
  undefined1 (*pauVar59) [16];
  uint in_ECX;
  long in_RDX;
  long in_RSI;
  undefined4 *in_RDI;
  uint in_R8D;
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [16];
  __m128i d [4];
  __m128i dstvec [4];
  int i;
  int base_max_diff;
  int base;
  __m128i a1_128;
  __m128i a0_128;
  __m128i res1;
  __m256i shift;
  __m256i res;
  __m256i b;
  int r;
  int x;
  __m128i a_mbase_x;
  __m256i c3f;
  __m256i diff;
  __m256i a16;
  __m256i a32;
  __m256i a1;
  __m256i a0;
  int max_base_x;
  int frac_bits;
  undefined4 local_820 [4];
  undefined4 local_810 [4];
  undefined4 local_800 [4];
  undefined4 local_7f0 [4];
  longlong local_7e0 [4];
  longlong local_7c0 [2];
  longlong local_7b0 [4];
  long local_790;
  undefined4 *local_788;
  int local_6fc;
  int local_6f8;
  int local_6f4;
  undefined1 local_6f0 [16];
  undefined1 local_6e0 [16];
  undefined8 local_6d0;
  undefined8 uStack_6c8;
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  int local_658;
  uint local_654;
  longlong local_650;
  longlong lStack_648;
  undefined1 local_640 [16];
  undefined1 auStack_630 [16];
  undefined1 local_620 [32];
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  int local_568;
  int local_564;
  byte local_55c;
  longlong *local_550;
  undefined4 local_548;
  undefined4 local_544;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  ushort local_4a8;
  ushort local_4a6;
  undefined2 local_4a4;
  undefined2 local_4a2;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined8 local_470;
  undefined8 uStack_468;
  uint8_t local_460 [8];
  uint8_t auStack_458 [8];
  undefined8 local_450;
  undefined8 uStack_448;
  undefined1 local_440 [16];
  undefined1 auStack_430 [16];
  undefined2 local_420;
  undefined2 local_41e;
  undefined2 local_41c;
  undefined2 local_41a;
  undefined2 local_418;
  undefined2 local_416;
  undefined2 local_414;
  undefined2 local_412;
  undefined2 local_410;
  undefined2 local_40e;
  undefined2 local_40c;
  undefined2 local_40a;
  undefined2 local_408;
  undefined2 local_406;
  undefined2 local_404;
  undefined2 local_402;
  undefined1 local_400 [32];
  undefined2 local_3e0;
  undefined2 local_3de;
  undefined2 local_3dc;
  undefined2 local_3da;
  undefined2 local_3d8;
  undefined2 local_3d6;
  undefined2 local_3d4;
  undefined2 local_3d2;
  undefined2 local_3d0;
  undefined2 local_3ce;
  undefined2 local_3cc;
  undefined2 local_3ca;
  undefined2 local_3c8;
  undefined2 local_3c6;
  undefined2 local_3c4;
  undefined2 local_3c2;
  undefined1 local_3c0 [32];
  ushort local_3a0;
  ushort local_39e;
  ushort local_39c;
  ushort local_39a;
  ushort local_398;
  ushort local_396;
  ushort local_394;
  ushort local_392;
  ushort local_390;
  ushort local_38e;
  ushort local_38c;
  ushort local_38a;
  ushort local_388;
  ushort local_386;
  ushort local_384;
  ushort local_382;
  undefined1 local_380 [32];
  ushort local_360;
  ushort local_35e;
  ushort local_35c;
  ushort local_35a;
  ushort local_358;
  ushort local_356;
  ushort local_354;
  ushort local_352;
  ushort local_350;
  ushort local_34e;
  ushort local_34c;
  ushort local_34a;
  ushort local_348;
  ushort local_346;
  ushort local_344;
  ushort local_342;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined1 auStack_330 [16];
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined1 local_2c0 [16];
  undefined1 auStack_2b0 [16];
  undefined1 local_2a0 [16];
  undefined1 auStack_290 [16];
  undefined1 local_280 [16];
  undefined1 auStack_270 [16];
  undefined1 local_260 [32];
  undefined1 (*local_238) [16];
  undefined1 (*local_230) [16];
  undefined4 local_224;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined4 local_1e4;
  undefined1 local_1e0 [32];
  undefined4 local_1a4;
  undefined1 local_1a0 [32];
  undefined4 local_164;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_120 [16];
  undefined1 auStack_110 [16];
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  longlong local_90;
  longlong lStack_88;
  byte local_71;
  undefined1 local_70 [16];
  byte local_60;
  byte local_5f;
  byte local_5e;
  byte local_5d;
  byte local_5c;
  byte local_5b;
  byte local_5a;
  byte local_59;
  byte local_58;
  byte local_57;
  byte local_56;
  byte local_55;
  byte local_54;
  byte local_53;
  byte local_52;
  byte local_51;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  auVar54._8_8_ = auStack_2b0._8_8_;
  auVar54._0_8_ = auStack_2b0._0_8_;
  auVar53._8_8_ = local_2c0._8_8_;
  auVar53._0_8_ = local_2c0._0_8_;
  auVar52._8_8_ = auStack_270._8_8_;
  auVar52._0_8_ = auStack_270._0_8_;
  auVar51._8_8_ = local_280._8_8_;
  auVar51._0_8_ = local_280._0_8_;
  auVar61._24_8_ = auStack_110._8_8_;
  auVar61._16_8_ = auStack_110._0_8_;
  auVar61._8_8_ = local_120._8_8_;
  auVar61._0_8_ = local_120._0_8_;
  auVar62._24_8_ = auStack_290._8_8_;
  auVar62._16_8_ = auStack_290._0_8_;
  auVar62._8_8_ = local_2a0._8_8_;
  auVar62._0_8_ = local_2a0._0_8_;
  local_544 = 4;
  local_548 = 4;
  local_55c = (byte)in_ECX;
  iVar55 = 7 << (local_55c & 0x1f);
  local_4a2 = 0x10;
  local_402 = 0x10;
  local_404 = 0x10;
  local_406 = 0x10;
  local_408 = 0x10;
  local_40a = 0x10;
  local_40c = 0x10;
  local_40e = 0x10;
  local_410 = 0x10;
  local_412 = 0x10;
  local_414 = 0x10;
  local_416 = 0x10;
  local_418 = 0x10;
  local_41a = 0x10;
  local_41c = 0x10;
  local_41e = 0x10;
  local_420 = 0x10;
  auVar2 = vpinsrw_avx(ZEXT216(0x10),0x10,1);
  auVar2 = vpinsrw_avx(auVar2,0x10,2);
  auVar2 = vpinsrw_avx(auVar2,0x10,3);
  auVar2 = vpinsrw_avx(auVar2,0x10,4);
  auVar2 = vpinsrw_avx(auVar2,0x10,5);
  auVar2 = vpinsrw_avx(auVar2,0x10,6);
  auVar3 = vpinsrw_avx(auVar2,0x10,7);
  auVar2 = vpinsrw_avx(ZEXT216(0x10),0x10,1);
  auVar2 = vpinsrw_avx(auVar2,0x10,2);
  auVar2 = vpinsrw_avx(auVar2,0x10,3);
  auVar2 = vpinsrw_avx(auVar2,0x10,4);
  auVar2 = vpinsrw_avx(auVar2,0x10,5);
  auVar2 = vpinsrw_avx(auVar2,0x10,6);
  auVar4 = vpinsrw_avx(auVar2,0x10,7);
  local_440._0_8_ = auVar3._0_8_;
  local_440._8_8_ = auVar3._8_8_;
  auStack_430._0_8_ = auVar4._0_8_;
  auStack_430._8_8_ = auVar4._8_8_;
  local_600 = local_440._0_8_;
  uStack_5f8 = local_440._8_8_;
  uStack_5f0 = auStack_430._0_8_;
  uStack_5e8 = auStack_430._8_8_;
  bVar1 = *(byte *)(in_RDX + iVar55);
  auVar2 = vpinsrb_avx(ZEXT116(bVar1),(uint)bVar1,1);
  auVar2 = vpinsrb_avx(auVar2,(uint)bVar1,2);
  auVar2 = vpinsrb_avx(auVar2,(uint)bVar1,3);
  auVar2 = vpinsrb_avx(auVar2,(uint)bVar1,4);
  auVar2 = vpinsrb_avx(auVar2,(uint)bVar1,5);
  auVar2 = vpinsrb_avx(auVar2,(uint)bVar1,6);
  auVar2 = vpinsrb_avx(auVar2,(uint)bVar1,7);
  auVar2 = vpinsrb_avx(auVar2,(uint)bVar1,8);
  auVar2 = vpinsrb_avx(auVar2,(uint)bVar1,9);
  auVar2 = vpinsrb_avx(auVar2,(uint)bVar1,10);
  auVar2 = vpinsrb_avx(auVar2,(uint)bVar1,0xb);
  auVar2 = vpinsrb_avx(auVar2,(uint)bVar1,0xc);
  auVar2 = vpinsrb_avx(auVar2,(uint)bVar1,0xd);
  auVar2 = vpinsrb_avx(auVar2,(uint)bVar1,0xe);
  auVar2 = vpinsrb_avx(auVar2,(uint)bVar1,0xf);
  local_70._0_8_ = auVar2._0_8_;
  local_70._8_8_ = auVar2._8_8_;
  local_650 = local_70._0_8_;
  lStack_648 = local_70._8_8_;
  local_4a4 = 0x3f;
  local_3c2 = 0x3f;
  local_3c4 = 0x3f;
  local_3c6 = 0x3f;
  local_3c8 = 0x3f;
  local_3ca = 0x3f;
  local_3cc = 0x3f;
  local_3ce = 0x3f;
  local_3d0 = 0x3f;
  local_3d2 = 0x3f;
  local_3d4 = 0x3f;
  local_3d6 = 0x3f;
  local_3d8 = 0x3f;
  local_3da = 0x3f;
  local_3dc = 0x3f;
  local_3de = 0x3f;
  local_3e0 = 0x3f;
  auVar5 = vpinsrw_avx(ZEXT216(0x3f),0x3f,1);
  auVar5 = vpinsrw_avx(auVar5,0x3f,2);
  auVar5 = vpinsrw_avx(auVar5,0x3f,3);
  auVar5 = vpinsrw_avx(auVar5,0x3f,4);
  auVar5 = vpinsrw_avx(auVar5,0x3f,5);
  auVar5 = vpinsrw_avx(auVar5,0x3f,6);
  auVar5 = vpinsrw_avx(auVar5,0x3f,7);
  auVar63 = vpinsrw_avx(ZEXT216(0x3f),0x3f,1);
  auVar63 = vpinsrw_avx(auVar63,0x3f,2);
  auVar63 = vpinsrw_avx(auVar63,0x3f,3);
  auVar63 = vpinsrw_avx(auVar63,0x3f,4);
  auVar63 = vpinsrw_avx(auVar63,0x3f,5);
  auVar63 = vpinsrw_avx(auVar63,0x3f,6);
  auVar63 = vpinsrw_avx(auVar63,0x3f,7);
  auVar60._0_16_ = ZEXT116(0) * auVar5 + ZEXT116(1) * auVar63;
  auVar60._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar5;
  local_400._16_8_ = auVar60._16_8_;
  local_400._24_8_ = auVar60._24_8_;
  local_658 = 0;
  local_654 = in_R8D;
  while( true ) {
    if (3 < local_658) goto LAB_005b3f25;
    iVar56 = (int)local_654 >> ((byte)(6 - in_ECX) & 0x1f);
    iVar57 = iVar55 - iVar56 >> (local_55c & 0x1f);
    local_6f8 = iVar57;
    local_6f4 = iVar56;
    if (iVar57 < 1) break;
    if (4 < iVar57) {
      local_6f8 = 4;
    }
    pauVar58 = (undefined1 (*) [16])(in_RDX + iVar56);
    local_6e0 = *pauVar58;
    pauVar59 = (undefined1 (*) [16])(in_RDX + iVar56 + 1);
    local_6f0 = *pauVar59;
    if (in_ECX == 0) {
      local_4a8 = (ushort)local_654;
      local_342 = (ushort)local_654;
      local_344 = (ushort)local_654;
      local_346 = (ushort)local_654;
      local_348 = (ushort)local_654;
      local_34a = (ushort)local_654;
      local_34c = (ushort)local_654;
      local_34e = (ushort)local_654;
      local_350 = (ushort)local_654;
      local_352 = (ushort)local_654;
      local_354 = (ushort)local_654;
      local_356 = (ushort)local_654;
      local_358 = (ushort)local_654;
      local_35a = (ushort)local_654;
      local_35c = (ushort)local_654;
      local_35e = (ushort)local_654;
      local_360 = (ushort)local_654;
      auVar5 = vpinsrw_avx(ZEXT216((ushort)local_654),local_654 & 0xffff,1);
      auVar5 = vpinsrw_avx(auVar5,local_654 & 0xffff,2);
      auVar5 = vpinsrw_avx(auVar5,local_654 & 0xffff,3);
      auVar5 = vpinsrw_avx(auVar5,local_654 & 0xffff,4);
      auVar5 = vpinsrw_avx(auVar5,local_654 & 0xffff,5);
      auVar5 = vpinsrw_avx(auVar5,local_654 & 0xffff,6);
      auVar5 = vpinsrw_avx(auVar5,local_654 & 0xffff,7);
      auVar63 = vpinsrw_avx(ZEXT216((ushort)local_654),local_654 & 0xffff,1);
      auVar63 = vpinsrw_avx(auVar63,local_654 & 0xffff,2);
      auVar63 = vpinsrw_avx(auVar63,local_654 & 0xffff,3);
      auVar63 = vpinsrw_avx(auVar63,local_654 & 0xffff,4);
      auVar63 = vpinsrw_avx(auVar63,local_654 & 0xffff,5);
      auVar63 = vpinsrw_avx(auVar63,local_654 & 0xffff,6);
      auVar63 = vpinsrw_avx(auVar63,local_654 & 0xffff,7);
      auVar62._0_16_ = ZEXT116(0) * auVar5 + ZEXT116(1) * auVar63;
      auVar62._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar5;
      local_380._16_8_ = auVar62._16_8_;
      local_380._24_8_ = auVar62._24_8_;
      auVar6._16_8_ = local_380._16_8_;
      auVar6._0_16_ = auVar62._0_16_;
      auVar6._24_8_ = local_380._24_8_;
      auVar10._16_8_ = local_400._16_8_;
      auVar10._0_16_ = auVar60._0_16_;
      auVar10._24_8_ = local_400._24_8_;
      local_1e0 = vpand_avx2(auVar6,auVar10);
      local_1e4 = 1;
      local_6c0 = vpsrlw_avx2(local_1e0,ZEXT416(1));
      local_380 = auVar62;
      auVar53 = auVar60._0_16_;
      auVar54 = auVar60._16_16_;
    }
    else {
      local_460 = (uint8_t  [8])EvenOddMaskx[0]._0_8_;
      auStack_458 = (uint8_t  [8])EvenOddMaskx[0]._8_8_;
      auVar5._8_8_ = EvenOddMaskx[0]._8_8_;
      auVar5._0_8_ = EvenOddMaskx[0]._0_8_;
      local_6e0 = vpshufb_avx(*pauVar58,auVar5);
      local_6f0 = vpsrldq_avx(local_6e0,8);
      local_4a6 = (ushort)local_654;
      local_382 = (ushort)local_654;
      local_384 = (ushort)local_654;
      local_386 = (ushort)local_654;
      local_388 = (ushort)local_654;
      local_38a = (ushort)local_654;
      local_38c = (ushort)local_654;
      local_38e = (ushort)local_654;
      local_390 = (ushort)local_654;
      local_392 = (ushort)local_654;
      local_394 = (ushort)local_654;
      local_396 = (ushort)local_654;
      local_398 = (ushort)local_654;
      local_39a = (ushort)local_654;
      local_39c = (ushort)local_654;
      local_39e = (ushort)local_654;
      local_3a0 = (ushort)local_654;
      auVar5 = vpinsrw_avx(ZEXT216((ushort)local_654),local_654 & 0xffff,1);
      auVar5 = vpinsrw_avx(auVar5,local_654 & 0xffff,2);
      auVar5 = vpinsrw_avx(auVar5,local_654 & 0xffff,3);
      auVar5 = vpinsrw_avx(auVar5,local_654 & 0xffff,4);
      auVar5 = vpinsrw_avx(auVar5,local_654 & 0xffff,5);
      auVar5 = vpinsrw_avx(auVar5,local_654 & 0xffff,6);
      auVar5 = vpinsrw_avx(auVar5,local_654 & 0xffff,7);
      auVar63 = vpinsrw_avx(ZEXT216((ushort)local_654),local_654 & 0xffff,1);
      auVar63 = vpinsrw_avx(auVar63,local_654 & 0xffff,2);
      auVar63 = vpinsrw_avx(auVar63,local_654 & 0xffff,3);
      auVar63 = vpinsrw_avx(auVar63,local_654 & 0xffff,4);
      auVar63 = vpinsrw_avx(auVar63,local_654 & 0xffff,5);
      auVar63 = vpinsrw_avx(auVar63,local_654 & 0xffff,6);
      auVar63 = vpinsrw_avx(auVar63,local_654 & 0xffff,7);
      auVar61._0_16_ = ZEXT116(0) * auVar5 + ZEXT116(1) * auVar63;
      auVar61._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar5;
      local_3c0._16_8_ = auVar61._16_8_;
      local_3c0._24_8_ = auVar61._24_8_;
      auVar8._16_8_ = local_3c0._16_8_;
      auVar8._0_16_ = auVar61._0_16_;
      auVar8._24_8_ = local_3c0._24_8_;
      local_260 = vpsllw_avx2(auVar8,ZEXT416(in_ECX));
      auVar7._16_8_ = local_400._16_8_;
      auVar7._0_16_ = auVar60._0_16_;
      auVar7._24_8_ = local_400._24_8_;
      local_1a0 = vpand_avx2(local_260,auVar7);
      local_1a4 = 1;
      local_6c0 = vpsrlw_avx2(local_1a0,ZEXT416(1));
      local_450 = *(undefined8 *)*pauVar58;
      uStack_448 = *(undefined8 *)(*pauVar58 + 8);
      local_3c0 = auVar61;
      auVar51 = auVar60._0_16_;
      auVar52 = auVar60._16_16_;
    }
    auVar7 = vpmovzxbw_avx2(local_6e0);
    auVar8 = vpmovzxbw_avx2(local_6f0);
    local_5c0._0_8_ = auVar8._0_8_;
    uVar18 = local_5c0._0_8_;
    local_5c0._8_8_ = auVar8._8_8_;
    uVar19 = local_5c0._8_8_;
    local_5c0._16_8_ = auVar8._16_8_;
    uVar20 = local_5c0._16_8_;
    local_5c0._24_8_ = auVar8._24_8_;
    uVar21 = local_5c0._24_8_;
    local_5a0._0_8_ = auVar7._0_8_;
    uVar22 = local_5a0._0_8_;
    local_5a0._8_8_ = auVar7._8_8_;
    uVar23 = local_5a0._8_8_;
    local_5a0._16_8_ = auVar7._16_8_;
    uVar24 = local_5a0._16_8_;
    local_5a0._24_8_ = auVar7._24_8_;
    uVar25 = local_5a0._24_8_;
    auVar11 = vpsubw_avx2(auVar8,auVar7);
    local_164 = 5;
    auVar10 = vpsllw_avx2(auVar7,ZEXT416(5));
    local_5e0._0_8_ = auVar10._0_8_;
    uVar26 = local_5e0._0_8_;
    local_5e0._8_8_ = auVar10._8_8_;
    uVar27 = local_5e0._8_8_;
    local_5e0._16_8_ = auVar10._16_8_;
    uVar28 = local_5e0._16_8_;
    local_5e0._24_8_ = auVar10._24_8_;
    uVar29 = local_5e0._24_8_;
    auVar9._16_8_ = auStack_430._0_8_;
    auVar9._0_16_ = auVar3;
    auVar9._24_8_ = auStack_430._8_8_;
    auVar6 = vpaddw_avx2(auVar10,auVar9);
    local_620._0_8_ = auVar11._0_8_;
    uVar30 = local_620._0_8_;
    local_620._8_8_ = auVar11._8_8_;
    uVar31 = local_620._8_8_;
    local_620._16_8_ = auVar11._16_8_;
    uVar32 = local_620._16_8_;
    local_620._24_8_ = auVar11._24_8_;
    uVar33 = local_620._24_8_;
    auVar9 = vpmullw_avx2(auVar11,local_6c0);
    local_5e0._0_8_ = auVar6._0_8_;
    uVar34 = local_5e0._0_8_;
    local_5e0._8_8_ = auVar6._8_8_;
    uVar35 = local_5e0._8_8_;
    local_5e0._16_8_ = auVar6._16_8_;
    uVar36 = local_5e0._16_8_;
    local_5e0._24_8_ = auVar6._24_8_;
    uVar37 = local_5e0._24_8_;
    local_680._0_8_ = auVar9._0_8_;
    uVar38 = local_680._0_8_;
    local_680._8_8_ = auVar9._8_8_;
    uVar39 = local_680._8_8_;
    local_680._16_8_ = auVar9._16_8_;
    uVar40 = local_680._16_8_;
    local_680._24_8_ = auVar9._24_8_;
    uVar41 = local_680._24_8_;
    auVar10 = vpaddw_avx2(auVar6,auVar9);
    local_6a0._0_8_ = auVar10._0_8_;
    uVar42 = local_6a0._0_8_;
    local_6a0._8_8_ = auVar10._8_8_;
    uVar43 = local_6a0._8_8_;
    local_6a0._16_8_ = auVar10._16_8_;
    uVar44 = local_6a0._16_8_;
    local_6a0._24_8_ = auVar10._24_8_;
    uVar45 = local_6a0._24_8_;
    local_224 = 5;
    auVar63 = ZEXT416(5);
    auVar10 = vpsrlw_avx2(auVar10,auVar63);
    local_6a0._0_8_ = auVar10._0_8_;
    uVar46 = local_6a0._0_8_;
    local_6a0._8_8_ = auVar10._8_8_;
    uVar47 = local_6a0._8_8_;
    local_6a0._16_8_ = auVar10._16_8_;
    uVar12 = local_6a0._16_8_;
    local_6a0._24_8_ = auVar10._24_8_;
    uVar13 = local_6a0._24_8_;
    auVar50._16_16_ = auVar63;
    auVar50._0_16_ = auVar10._16_16_;
    auVar10 = vpackuswb_avx2(auVar10,auVar50);
    local_6a0._0_8_ = auVar10._0_8_;
    uVar14 = local_6a0._0_8_;
    local_6a0._8_8_ = auVar10._8_8_;
    uVar15 = local_6a0._8_8_;
    local_6a0._16_8_ = auVar10._16_8_;
    uVar48 = local_6a0._16_8_;
    local_6a0._24_8_ = auVar10._24_8_;
    uVar49 = local_6a0._24_8_;
    uVar16 = *(undefined8 *)BaseMask[local_6f8];
    uVar17 = *(undefined8 *)(BaseMask[local_6f8] + 8);
    auVar5 = vpblendvb_avx(auVar2,auVar10._0_16_,*(undefined1 (*) [16])BaseMask[local_6f8]);
    *(undefined1 (*) [16])(local_7e0 + (long)local_658 * 2) = auVar5;
    local_654 = in_R8D + local_654;
    local_658 = local_658 + 1;
    local_6d0 = local_6a0._0_8_;
    uStack_6c8 = local_6a0._8_8_;
    local_6a0 = auVar10;
    local_680 = auVar9;
    local_620 = auVar11;
    local_5e0 = auVar6;
    local_5c0 = auVar8;
    local_5a0 = auVar7;
    local_540 = uVar38;
    uStack_538 = uVar39;
    uStack_530 = uVar40;
    uStack_528 = uVar41;
    local_520 = uVar34;
    uStack_518 = uVar35;
    uStack_510 = uVar36;
    uStack_508 = uVar37;
    local_500 = local_440._0_8_;
    uStack_4f8 = local_440._8_8_;
    uStack_4f0 = auStack_430._0_8_;
    uStack_4e8 = auStack_430._8_8_;
    local_4e0 = uVar26;
    uStack_4d8 = uVar27;
    uStack_4d0 = uVar28;
    uStack_4c8 = uVar29;
    local_4a0 = uVar14;
    uStack_498 = uVar15;
    uStack_490 = uVar48;
    uStack_488 = uVar49;
    local_470 = uVar12;
    uStack_468 = uVar13;
    local_340 = uVar12;
    uStack_338 = uVar13;
    auStack_330 = auVar63;
    local_320 = uVar46;
    uStack_318 = uVar47;
    uStack_310 = uVar12;
    uStack_308 = uVar13;
    local_300 = uVar22;
    uStack_2f8 = uVar23;
    uStack_2f0 = uVar24;
    uStack_2e8 = uVar25;
    local_2e0 = uVar18;
    uStack_2d8 = uVar19;
    uStack_2d0 = uVar20;
    uStack_2c8 = uVar21;
    local_238 = pauVar59;
    local_230 = pauVar58;
    local_220 = uVar42;
    uStack_218 = uVar43;
    uStack_210 = uVar44;
    uStack_208 = uVar45;
    local_160 = uVar22;
    uStack_158 = uVar23;
    uStack_150 = uVar24;
    uStack_148 = uVar25;
    local_100 = local_6c0._0_8_;
    uStack_f8 = local_6c0._8_8_;
    uStack_f0 = local_6c0._16_8_;
    uStack_e8 = local_6c0._24_8_;
    local_e0 = uVar30;
    uStack_d8 = uVar31;
    uStack_d0 = uVar32;
    uStack_c8 = uVar33;
    local_b0 = uVar16;
    uStack_a8 = uVar17;
    local_a0 = uVar14;
    uStack_98 = uVar15;
    local_90 = local_70._0_8_;
    lStack_88 = local_70._8_8_;
    local_50 = local_6f0._0_8_;
    uStack_48 = local_6f0._8_8_;
    local_40 = local_6e0._0_8_;
    uStack_38 = local_6e0._8_8_;
  }
  for (local_6fc = local_658; local_6fc < 4; local_6fc = local_6fc + 1) {
    local_7e0[(long)local_6fc * 2] = local_70._0_8_;
    local_7e0[(long)local_6fc * 2 + 1] = local_70._8_8_;
  }
LAB_005b3f25:
  local_790 = in_RSI;
  local_788 = in_RDI;
  local_568 = iVar55;
  local_564 = 6 - in_ECX;
  local_550 = local_7e0;
  local_440 = auVar3;
  auStack_430 = auVar4;
  local_400 = auVar60;
  local_71 = bVar1;
  local_70 = auVar2;
  local_60 = bVar1;
  local_5f = bVar1;
  local_5e = bVar1;
  local_5d = bVar1;
  local_5c = bVar1;
  local_5b = bVar1;
  local_5a = bVar1;
  local_59 = bVar1;
  local_58 = bVar1;
  local_57 = bVar1;
  local_56 = bVar1;
  local_55 = bVar1;
  local_54 = bVar1;
  local_53 = bVar1;
  local_52 = bVar1;
  local_51 = bVar1;
  local_640 = auVar60._0_16_;
  auStack_630 = auVar60._16_16_;
  local_2a0 = auVar62._0_16_;
  auStack_290 = auVar62._16_16_;
  local_120 = auVar61._0_16_;
  auStack_110 = auVar61._16_16_;
  local_280 = auVar51;
  auStack_270 = auVar52;
  local_2c0 = auVar53;
  auStack_2b0 = auVar54;
  transpose4x8_8x4_low_sse2
            ((__m128i *)local_7e0,(__m128i *)(local_7e0 + 2),(__m128i *)(local_7e0 + 4),
             (__m128i *)local_7b0,(__m128i *)local_820,(__m128i *)local_810,(__m128i *)local_800,
             (__m128i *)local_7f0);
  *local_788 = local_820[0];
  *(undefined4 *)((long)local_788 + local_790) = local_810[0];
  *(undefined4 *)((long)local_788 + local_790 * 2) = local_800[0];
  *(undefined4 *)((long)local_788 + local_790 * 3) = local_7f0[0];
  return;
}

Assistant:

static void dr_prediction_z3_4x4_avx2(uint8_t *dst, ptrdiff_t stride,
                                      const uint8_t *left, int upsample_left,
                                      int dy) {
  __m128i dstvec[4], d[4];

  dr_prediction_z1_HxW_internal_avx2(4, 4, dstvec, left, upsample_left, dy);
  transpose4x8_8x4_low_sse2(&dstvec[0], &dstvec[1], &dstvec[2], &dstvec[3],
                            &d[0], &d[1], &d[2], &d[3]);

  *(int *)(dst + stride * 0) = _mm_cvtsi128_si32(d[0]);
  *(int *)(dst + stride * 1) = _mm_cvtsi128_si32(d[1]);
  *(int *)(dst + stride * 2) = _mm_cvtsi128_si32(d[2]);
  *(int *)(dst + stride * 3) = _mm_cvtsi128_si32(d[3]);
  return;
}